

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__horizontal_gather_1_channels_with_n_coeffs_mod3
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  undefined8 uVar1;
  undefined8 uVar2;
  float *pfVar3;
  float *pfVar4;
  __m128 c;
  __m128 tot;
  float *local_210;
  float *hc;
  float *pfStack_200;
  int n;
  float *decode;
  __m128 mask;
  float *local_1e0;
  float *output;
  float *output_end;
  float *pfStack_1c8;
  int coefficient_width_local;
  float *horizontal_coefficients_local;
  stbir__contributors *horizontal_contributors_local;
  float *decode_buffer_local;
  uint output_sub_size_local;
  float *output_buffer_local;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  
  local_1e0 = output_buffer;
  pfStack_1c8 = horizontal_coefficients;
  horizontal_coefficients_local = (float *)horizontal_contributors;
  do {
    pfVar4 = decode_buffer + (int)*horizontal_coefficients_local;
    hc._4_4_ = ((int)horizontal_coefficients_local[1] - (int)*horizontal_coefficients_local) + -3 >>
               2;
    local_210 = pfStack_1c8;
    local_b8 = (float)*(undefined8 *)pfStack_1c8;
    fStack_b4 = (float)((ulong)*(undefined8 *)pfStack_1c8 >> 0x20);
    fStack_b0 = (float)*(undefined8 *)(pfStack_1c8 + 2);
    fStack_ac = (float)((ulong)*(undefined8 *)(pfStack_1c8 + 2) >> 0x20);
    local_c8 = (float)*(undefined8 *)pfVar4;
    fStack_c4 = (float)((ulong)*(undefined8 *)pfVar4 >> 0x20);
    fStack_c0 = (float)*(undefined8 *)(pfVar4 + 2);
    fStack_bc = (float)((ulong)*(undefined8 *)(pfVar4 + 2) >> 0x20);
    c[2] = local_b8 * local_c8;
    c[3] = fStack_b4 * fStack_c4;
    tot[0] = fStack_b0 * fStack_c0;
    tot[1] = fStack_ac * fStack_bc;
    pfVar3 = local_210;
    do {
      pfStack_200 = pfVar4;
      local_210 = pfVar3;
      uVar1 = *(undefined8 *)(local_210 + 4);
      uVar2 = *(undefined8 *)(pfStack_200 + 4);
      local_d8 = (float)uVar1;
      fStack_d4 = (float)((ulong)uVar1 >> 0x20);
      fStack_d0 = (float)*(undefined8 *)(local_210 + 6);
      fStack_cc = (float)((ulong)*(undefined8 *)(local_210 + 6) >> 0x20);
      local_e8 = (float)uVar2;
      fStack_e4 = (float)((ulong)uVar2 >> 0x20);
      fStack_e0 = (float)*(undefined8 *)(pfStack_200 + 6);
      fStack_dc = (float)((ulong)*(undefined8 *)(pfStack_200 + 6) >> 0x20);
      c[2] = c[2] + local_d8 * local_e8;
      c[3] = c[3] + fStack_d4 * fStack_e4;
      tot[0] = tot[0] + fStack_d0 * fStack_e0;
      tot[1] = tot[1] + fStack_cc * fStack_dc;
      hc._4_4_ = hc._4_4_ + -1;
      pfVar3 = local_210 + 4;
      pfVar4 = pfStack_200 + 4;
    } while (0 < hc._4_4_);
    local_f8 = (float)*(undefined8 *)(local_210 + 8);
    fStack_f4 = (float)((ulong)*(undefined8 *)(local_210 + 8) >> 0x20);
    fStack_f0 = (float)*(undefined8 *)(local_210 + 10);
    local_108 = (float)*(undefined8 *)(pfStack_200 + 8);
    fStack_104 = (float)((ulong)*(undefined8 *)(pfStack_200 + 8) >> 0x20);
    fStack_100 = (float)*(undefined8 *)(pfStack_200 + 10);
    fStack_fc = (float)((ulong)*(undefined8 *)(pfStack_200 + 10) >> 0x20);
    *local_1e0 = c[2] + local_f8 * local_108 + tot[0] + fStack_f0 * fStack_100 +
                 c[3] + fStack_f4 * fStack_104 + tot[1] + fStack_fc * 0.0;
    pfStack_1c8 = pfStack_1c8 + coefficient_width;
    horizontal_coefficients_local = horizontal_coefficients_local + 2;
    local_1e0 = local_1e0 + 1;
  } while (local_1e0 < output_buffer + output_sub_size);
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_n_coeffs_mod3 )( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  stbir__3_coeff_setup();
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    int n = ( ( horizontal_contributors->n1 - horizontal_contributors->n0 + 1 ) - 7 + 3 ) >> 2;
    float const * hc = horizontal_coefficients;

    stbir__4_coeff_start();
    STBIR_SIMD_NO_UNROLL_LOOP_START
    do {
      hc += 4;
      decode += STBIR__horizontal_channels * 4;
      stbir__4_coeff_continue_from_4( 0 );
      --n;
    } while ( n > 0 );
    stbir__3_coeff_remnant( 4 );

    stbir__store_output();
  } while ( output < output_end );
}